

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hq3x_16.cpp
# Opt level: O2

void Interp4(uchar *pc,int c1,int c2,int c3)

{
  uint uVar1;
  uint uVar2;
  uint5 uVar3;
  ushort uVar4;
  ushort uVar6;
  ushort uVar8;
  uint5 uVar7;
  undefined8 uVar5;
  ushort uVar9;
  
  uVar1 = (uint)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)c2 >> 0x18) << 0x30) >> 0x28)
                                          ,CONCAT14((char)((uint)c2 >> 0x10),c2)) >> 0x20),c2) >>
                0x18);
  uVar7 = (uint5)uVar1 & 0xffffffff00;
  uVar2 = (uint)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((uint)c3 >> 0x18) << 0x30) >> 0x28)
                                          ,CONCAT14((char)((uint)c3 >> 0x10),c3)) >> 0x20),c3) >>
                0x18);
  uVar3 = (uint5)uVar2 & 0xffffffff00;
  uVar5 = psllw((ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte
                                                  )((uint)c1 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)c1 >> 0x10),c1)) >> 0x20),c1
                                                  ) >> 0x18),
                                                CONCAT12((char)((uint)c1 >> 8),(short)c1)) >> 0x10),
                                (short)c1) & 0xffffffff00ff00ff,1);
  uVar4 = (ushort)((short)uVar5 + (((ushort)c3 & 0xff) + ((ushort)c2 & 0xff)) * 7) >> 4;
  uVar6 = (ushort)((short)((ulong)uVar5 >> 0x10) +
                  (((ushort)(CONCAT43(uVar2,CONCAT12((char)((uint)c3 >> 8),(ushort)c3)) >> 0x10) &
                   0xff) + ((ushort)(CONCAT43(uVar1,CONCAT12((char)((uint)c2 >> 8),(ushort)c2)) >>
                                    0x10) & 0xff)) * 7) >> 4;
  uVar8 = (ushort)((short)((ulong)uVar5 >> 0x20) + ((short)(uVar3 >> 8) + (short)(uVar7 >> 8)) * 7)
          >> 4;
  uVar9 = (ushort)((short)((ulong)uVar5 >> 0x30) +
                  ((short)(uVar3 >> 0x18) + (short)(uVar7 >> 0x18)) * 7) >> 4;
  *(uint *)pc = CONCAT13((uVar9 != 0) * (uVar9 < 0x100) * (char)uVar9 - (0xff < uVar9),
                         CONCAT12((uVar8 != 0) * (uVar8 < 0x100) * (char)uVar8 - (0xff < uVar8),
                                  CONCAT11((uVar6 != 0) * (uVar6 < 0x100) * (char)uVar6 -
                                           (0xff < uVar6),
                                           (uVar4 != 0) * (uVar4 < 0x100) * (char)uVar4 -
                                           (0xff < uVar4))));
  return;
}

Assistant:

inline void Interp4(unsigned char * pc, int c1, int c2, int c3)
{
  // *((int*)pc) = (c1*2+(c2+c3)*7)/16;

  hq_vec result = hq_vec::load(c2);

  result += hq_vec::load(c3);
  result *= const7;
  result += hq_vec::load(c1) << 1;
  result >> 4;

  result.store(pc);
}